

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

uint mwDrop_(uint kb,int type,int silent)

{
  mwGrabData *pmVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  uint uVar5;
  mwGrabData *__ptr;
  char *pcVar6;
  mwGrabData *pmVar7;
  
  uVar2 = 0;
  if (kb != 0 || mwGrabList != (mwGrabData *)0x0) {
    uVar2 = 60000;
    if (kb != 0) {
      uVar2 = kb;
    }
    pcVar6 = "no-mans-land";
    if (type == 0xfb) {
      pcVar6 = "grabbed";
    }
    pmVar7 = (mwGrabData *)0x0;
    __ptr = mwGrabList;
    uVar5 = uVar2;
    do {
      if (__ptr == (mwGrabData *)0x0) {
        uVar2 = uVar2 - uVar5;
        if (silent != 0 || uVar2 == 0) {
          return uVar2;
        }
        pcVar6 = "no-mans-land";
        if (type == 0xfb) {
          pcVar6 = "grabbed";
        }
        mwWrite("dropped: all %s memory (%u kb)\n",pcVar6,(ulong)uVar2);
        goto LAB_00108938;
      }
      if (__ptr->type == type) {
        if (pmVar7 != (mwGrabData *)0x0) {
          pmVar7->next = __ptr->next;
        }
        if (mwGrabList == __ptr) {
          mwGrabList = __ptr->next;
        }
        uVar5 = uVar5 - 1;
        pmVar1 = __ptr->next;
        lVar3 = 0xc;
        do {
          if (__ptr->blob[lVar3 + -0xc] != (char)type) {
            pcVar4 = __ptr->blob + lVar3 + -0xc;
            goto LAB_00108881;
          }
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 != 0x400);
        pcVar4 = (char *)0x0;
LAB_00108881:
        if (pcVar4 != (char *)0x0) {
          mwWrite("wild pointer: <%ld> %s memory hit at %p\n",mwCounter,pcVar6);
          mwFlush();
        }
        mwGrabSize = mwGrabSize + -0x400;
        free(__ptr);
      }
      else {
        pmVar1 = __ptr->next;
        pmVar7 = __ptr;
      }
      __ptr = pmVar1;
    } while (uVar5 != 0);
    if (silent == 0) {
      pcVar6 = "no-mans-land";
      if (type == 0xfb) {
        pcVar6 = "grabbed";
      }
      mwWrite("dropped: %u kilobytes of %s memory\n",uVar2,pcVar6);
LAB_00108938:
      mwFlush();
    }
  }
  return uVar2;
}

Assistant:

static unsigned mwDrop_(unsigned kb, int type, int silent)
{
	unsigned i = kb;
	mwGrabData *gd, *tmp, *pr;
	const void *p;

	if (mwGrabList == NULL && kb == 0) {
		return 0;
	}
	if (!kb) {
		i = kb = 60000U;
	}

	pr = NULL;
	gd = mwGrabList;
	for (; kb;) {
		if (gd == NULL) {
			if (i - kb > 0 && !silent) {
				mwWrite("dropped: all %s memory (%u kb)\n", mwGrabType(type), i - kb);
				FLUSH();
			}
			return i - kb;
		}
		if (gd->type == type) {
			if (pr) {
				pr->next = gd->next;
			}
			kb --;
			tmp = gd;
			if (mwGrabList == gd) {
				mwGrabList = gd->next;
			}
			gd = gd->next;
			p = mwTestMem(tmp->blob, sizeof(tmp->blob), type);
			if (p != NULL) {
				mwWrite("wild pointer: <%ld> %s memory hit at %p\n",
						mwCounter, mwGrabType(type), p);
				FLUSH();
			}
			mwGrabSize -= (long) sizeof(mwGrabData);
			free(tmp);
		} else {
			pr = gd;
			gd = gd->next;
		}
	}
	if (!silent) {
		mwWrite("dropped: %u kilobytes of %s memory\n", i, mwGrabType(type));
		FLUSH();
	}
	return i;
}